

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int whereLoopAddOr(WhereLoopBuilder *pBuilder,Bitmask mPrereq,Bitmask mUnusable)

{
  byte bVar1;
  LogEst a;
  LogEst a_00;
  int iVar2;
  WhereClause *pWVar3;
  WhereLoop *pTemplate;
  SrcList *pSVar4;
  WhereOrInfo *pWVar5;
  ulong uVar6;
  u16 uVar7;
  LogEst rRun;
  LogEst nOut;
  ulong uVar8;
  WhereTerm *pWVar9;
  WhereTerm *pWVar10;
  ulong uVar11;
  WhereTerm *pWVar12;
  WhereTerm *pWVar13;
  ulong uVar14;
  LogEst *pLVar15;
  ulong uVar16;
  bool bVar17;
  WhereOrSet sSum;
  WhereOrSet sCur;
  WhereClause tempWC;
  int local_3b4;
  WhereOrSet local_348;
  WhereLoopBuilder local_308;
  WhereOrSet local_2c8;
  ulong local_288;
  LogEst aLStack_280 [20];
  WhereInfo *local_258;
  WhereClause *local_250;
  undefined1 local_248;
  undefined4 local_244;
  WhereTerm *local_238;
  
  pWVar3 = pBuilder->pWC;
  pTemplate = pBuilder->pNew;
  pWVar12 = pWVar3->a;
  local_348.a[1].rRun = 0;
  local_348.a[1].nOut = 0;
  local_348.a[1]._12_4_ = 0;
  local_348.a[2].prereq = 0;
  local_348.a[0].rRun = 0;
  local_348.a[0].nOut = 0;
  local_348.a[0]._12_4_ = 0;
  local_348.a[1].prereq = 0;
  local_348._0_8_ = 0;
  local_348.a[0].prereq = 0;
  local_348.a[2].rRun = 0;
  local_348.a[2].nOut = 0;
  local_348.a[2]._12_4_ = 0;
  if ((long)pWVar3->nTerm < 1) {
    local_3b4 = 0;
  }
  else {
    pWVar9 = pWVar12 + pWVar3->nTerm;
    bVar1 = pTemplate->iTab;
    pSVar4 = pBuilder->pWInfo->pTabList;
    iVar2 = pSVar4->a[bVar1].iCursor;
    uVar14 = 0;
    do {
      if ((pWVar12->eOperator & 0x200) == 0) {
        local_3b4 = 0;
      }
      else {
        pWVar5 = (pWVar12->u).pOrInfo;
        if ((pWVar5->indexable & pTemplate->maskSelf) == 0) {
          local_3b4 = 0;
        }
        else {
          pWVar13 = (pWVar5->wc).a + (pWVar5->wc).nTerm;
          local_308.pNew = pBuilder->pNew;
          local_308.pRec = pBuilder->pRec;
          local_308.nRecValid = pBuilder->nRecValid;
          local_308.bldFlags = pBuilder->bldFlags;
          local_308.iPlanLimit = pBuilder->iPlanLimit;
          local_308._60_4_ = *(undefined4 *)&pBuilder->field_0x3c;
          local_308.pWInfo._0_4_ = *(undefined4 *)&pBuilder->pWInfo;
          local_308.pWInfo._4_4_ = *(undefined4 *)((long)&pBuilder->pWInfo + 4);
          local_308.pWC = pBuilder->pWC;
          local_308.pOrderBy = (ExprList *)0x0;
          local_308.pOrSet = &local_2c8;
          pWVar10 = (pWVar5->wc).a;
          local_3b4 = 0;
          if (pWVar10 < pWVar13) {
            local_3b4 = 0;
            bVar17 = true;
            do {
              if ((pWVar10->eOperator & 0x400) == 0) {
                if (pWVar10->leftCursor == iVar2) {
                  local_258 = pWVar3->pWInfo;
                  local_248 = 0x2c;
                  local_244 = 1;
                  local_308.pWC = (WhereClause *)&local_258;
                  local_250 = pWVar3;
                  local_238 = pWVar10;
                  goto LAB_00185f80;
                }
              }
              else {
                local_308.pWC = *(WhereClause **)&pWVar10->u;
LAB_00185f80:
                local_2c8.n = 0;
                if ((pSVar4->a[bVar1].pTab)->nModuleArg == 0) {
                  local_3b4 = whereLoopAddBtree(&local_308,mPrereq);
                }
                else {
                  local_3b4 = whereLoopAddVirtual(&local_308,mPrereq,mUnusable);
                }
                if (local_3b4 == 0) {
                  local_3b4 = whereLoopAddOr(&local_308,mPrereq,mUnusable);
                }
                if (local_2c8.n == 0) {
                  local_348._0_8_ = (ulong)(uint6)local_348._2_6_ << 0x10;
                  uVar14 = 0;
                  goto LAB_00186152;
                }
                if (bVar17) {
                  local_348.n = local_2c8.n;
                  memcpy(local_348.a,local_2c8.a,(ulong)local_2c8.n << 4);
                }
                else {
                  uVar7 = local_348.n;
                  uVar14 = local_348._0_8_ & 0xffff;
                  memcpy(&local_288,local_348.a,(local_348._0_8_ & 0xffff) << 4);
                  local_348._0_8_ = local_348._0_8_ & 0xffffffffffff0000;
                  if (uVar7 != 0) {
                    uVar8 = 1;
                    uVar11 = 0;
                    do {
                      if ((short)uVar8 == 0) {
                        uVar8 = 0;
                      }
                      else {
                        uVar6 = (&local_288)[uVar11 * 2];
                        a = aLStack_280[uVar11 * 8];
                        a_00 = aLStack_280[uVar11 * 8 + 1];
                        pLVar15 = &local_2c8.a[0].nOut;
                        uVar16 = 0;
                        do {
                          uVar8 = ((WhereOrCost *)(pLVar15 + -5))->prereq;
                          rRun = sqlite3LogEstAdd(a,pLVar15[-1]);
                          nOut = sqlite3LogEstAdd(a_00,*pLVar15);
                          whereOrInsert(&local_348,uVar8 | uVar6,rRun,nOut);
                          uVar16 = uVar16 + 1;
                          uVar8 = (ulong)local_2c8.n;
                          pLVar15 = pLVar15 + 8;
                        } while (uVar16 < uVar8);
                      }
                      uVar11 = uVar11 + 1;
                    } while (uVar11 != uVar14);
                  }
                }
                bVar17 = false;
              }
              pWVar10 = pWVar10 + 1;
            } while (pWVar10 < pWVar13);
            uVar14 = local_348._0_8_ & 0xffff;
          }
LAB_00186152:
          pTemplate->nLTerm = 1;
          *pTemplate->aLTerm = pWVar12;
          pTemplate->wsFlags = 0x2000;
          pTemplate->rSetup = 0;
          pTemplate->iSortIdx = '\0';
          *(undefined8 *)&pTemplate->u = 0;
          (pTemplate->u).btree.pIndex = (Index *)0x0;
          if ((short)uVar14 != 0 && local_3b4 == 0) {
            pLVar15 = &local_348.a[0].nOut;
            uVar8 = 1;
            do {
              pTemplate->rRun = (short)*(undefined4 *)(pLVar15 + -1) + 1;
              pTemplate->nOut = *pLVar15;
              pTemplate->prereq = ((WhereOrCost *)(pLVar15 + -5))->prereq;
              local_3b4 = whereLoopInsert(pBuilder,pTemplate);
              if (local_3b4 != 0) break;
              pLVar15 = pLVar15 + 8;
              bVar17 = uVar8 < uVar14;
              uVar8 = uVar8 + 1;
            } while (bVar17);
          }
        }
      }
    } while ((local_3b4 == 0) && (pWVar12 = pWVar12 + 1, pWVar12 < pWVar9));
  }
  return local_3b4;
}

Assistant:

static int whereLoopAddOr(
  WhereLoopBuilder *pBuilder, 
  Bitmask mPrereq, 
  Bitmask mUnusable
){
  WhereInfo *pWInfo = pBuilder->pWInfo;
  WhereClause *pWC;
  WhereLoop *pNew;
  WhereTerm *pTerm, *pWCEnd;
  int rc = SQLITE_OK;
  int iCur;
  WhereClause tempWC;
  WhereLoopBuilder sSubBuild;
  WhereOrSet sSum, sCur;
  struct SrcList_item *pItem;
  
  pWC = pBuilder->pWC;
  pWCEnd = pWC->a + pWC->nTerm;
  pNew = pBuilder->pNew;
  memset(&sSum, 0, sizeof(sSum));
  pItem = pWInfo->pTabList->a + pNew->iTab;
  iCur = pItem->iCursor;

  for(pTerm=pWC->a; pTerm<pWCEnd && rc==SQLITE_OK; pTerm++){
    if( (pTerm->eOperator & WO_OR)!=0
     && (pTerm->u.pOrInfo->indexable & pNew->maskSelf)!=0 
    ){
      WhereClause * const pOrWC = &pTerm->u.pOrInfo->wc;
      WhereTerm * const pOrWCEnd = &pOrWC->a[pOrWC->nTerm];
      WhereTerm *pOrTerm;
      int once = 1;
      int i, j;
    
      sSubBuild = *pBuilder;
      sSubBuild.pOrderBy = 0;
      sSubBuild.pOrSet = &sCur;

      WHERETRACE(0x200, ("Begin processing OR-clause %p\n", pTerm));
      for(pOrTerm=pOrWC->a; pOrTerm<pOrWCEnd; pOrTerm++){
        if( (pOrTerm->eOperator & WO_AND)!=0 ){
          sSubBuild.pWC = &pOrTerm->u.pAndInfo->wc;
        }else if( pOrTerm->leftCursor==iCur ){
          tempWC.pWInfo = pWC->pWInfo;
          tempWC.pOuter = pWC;
          tempWC.op = TK_AND;
          tempWC.nTerm = 1;
          tempWC.a = pOrTerm;
          sSubBuild.pWC = &tempWC;
        }else{
          continue;
        }
        sCur.n = 0;
#ifdef WHERETRACE_ENABLED
        WHERETRACE(0x200, ("OR-term %d of %p has %d subterms:\n", 
                   (int)(pOrTerm-pOrWC->a), pTerm, sSubBuild.pWC->nTerm));
        if( sqlite3WhereTrace & 0x400 ){
          sqlite3WhereClausePrint(sSubBuild.pWC);
        }
#endif
#ifndef SQLITE_OMIT_VIRTUALTABLE
        if( IsVirtual(pItem->pTab) ){
          rc = whereLoopAddVirtual(&sSubBuild, mPrereq, mUnusable);
        }else
#endif
        {
          rc = whereLoopAddBtree(&sSubBuild, mPrereq);
        }
        if( rc==SQLITE_OK ){
          rc = whereLoopAddOr(&sSubBuild, mPrereq, mUnusable);
        }
        assert( rc==SQLITE_OK || sCur.n==0 );
        if( sCur.n==0 ){
          sSum.n = 0;
          break;
        }else if( once ){
          whereOrMove(&sSum, &sCur);
          once = 0;
        }else{
          WhereOrSet sPrev;
          whereOrMove(&sPrev, &sSum);
          sSum.n = 0;
          for(i=0; i<sPrev.n; i++){
            for(j=0; j<sCur.n; j++){
              whereOrInsert(&sSum, sPrev.a[i].prereq | sCur.a[j].prereq,
                            sqlite3LogEstAdd(sPrev.a[i].rRun, sCur.a[j].rRun),
                            sqlite3LogEstAdd(sPrev.a[i].nOut, sCur.a[j].nOut));
            }
          }
        }
      }
      pNew->nLTerm = 1;
      pNew->aLTerm[0] = pTerm;
      pNew->wsFlags = WHERE_MULTI_OR;
      pNew->rSetup = 0;
      pNew->iSortIdx = 0;
      memset(&pNew->u, 0, sizeof(pNew->u));
      for(i=0; rc==SQLITE_OK && i<sSum.n; i++){
        /* TUNING: Currently sSum.a[i].rRun is set to the sum of the costs
        ** of all sub-scans required by the OR-scan. However, due to rounding
        ** errors, it may be that the cost of the OR-scan is equal to its
        ** most expensive sub-scan. Add the smallest possible penalty 
        ** (equivalent to multiplying the cost by 1.07) to ensure that 
        ** this does not happen. Otherwise, for WHERE clauses such as the
        ** following where there is an index on "y":
        **
        **     WHERE likelihood(x=?, 0.99) OR y=?
        **
        ** the planner may elect to "OR" together a full-table scan and an
        ** index lookup. And other similarly odd results.  */
        pNew->rRun = sSum.a[i].rRun + 1;
        pNew->nOut = sSum.a[i].nOut;
        pNew->prereq = sSum.a[i].prereq;
        rc = whereLoopInsert(pBuilder, pNew);
      }
      WHERETRACE(0x200, ("End processing OR-clause %p\n", pTerm));
    }
  }
  return rc;
}